

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O3

FuncflParameters * __thiscall
OpenMD::EAMAdapter::getFuncflParam(FuncflParameters *__return_storage_ptr__,EAMAdapter *this)

{
  undefined8 uVar1;
  RealType RVar2;
  undefined8 uVar3;
  RealType RVar4;
  RealType RVar5;
  bool bVar6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  shared_ptr<OpenMD::GenericData> data;
  undefined1 local_58 [16];
  string local_48;
  
  bVar6 = AtomType::hasProperty(this->at_,(string *)EAMtypeID_abi_cxx11_);
  if (!bVar6) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "EAMAdapter::getFuncflParam was passed an atomType (%s)\n\tthat does not appear to be an EAM atom.\n"
             ,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_58,(string *)this->at_);
  if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "EAMAdapter::getFuncflParam could not find Funcfl\n\tparameters for atomType %s.\n",
             local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((_func_int **)local_58._0_8_ != (_func_int **)0x0) goto LAB_0027812b;
  }
  else {
LAB_0027812b:
    lVar7 = __dynamic_cast(local_58._0_8_,&GenericData::typeinfo,
                           &SimpleTypeData<OpenMD::FuncflParameters>::typeinfo,0);
    if (lVar7 != 0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
        }
      }
      goto LAB_002781d5;
    }
  }
  AtomType::getName_abi_cxx11_(&local_48,this->at_);
  snprintf(painCave.errMsg,2000,
           "EAMAdapter::getFuncflParam could not convert\n\tGenericData to FuncflData for atom type %s\n"
           ,local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  painCave.isFatal = 1;
  painCave.severity = 1;
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  simError();
  lVar7 = 0;
LAB_002781d5:
  __return_storage_ptr__->rcut = *(RealType *)(lVar7 + 0x58);
  uVar1 = *(undefined8 *)(lVar7 + 0x28);
  RVar2 = *(RealType *)(lVar7 + 0x30);
  uVar3 = *(undefined8 *)(lVar7 + 0x38);
  RVar4 = *(RealType *)(lVar7 + 0x40);
  RVar5 = *(RealType *)(lVar7 + 0x50);
  *(undefined8 *)&__return_storage_ptr__->nr = *(undefined8 *)(lVar7 + 0x48);
  __return_storage_ptr__->dr = RVar5;
  *(undefined8 *)&__return_storage_ptr__->nrho = uVar3;
  __return_storage_ptr__->drho = RVar4;
  *(undefined8 *)__return_storage_ptr__ = uVar1;
  __return_storage_ptr__->atomicMass = RVar2;
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->Z,(vector<double,_std::allocator<double>_> *)(lVar7 + 0x60));
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->rho,(vector<double,_std::allocator<double>_> *)(lVar7 + 0x78))
  ;
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->F,(vector<double,_std::allocator<double>_> *)(lVar7 + 0x90));
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

FuncflParameters EAMAdapter::getFuncflParam() {
    if (!isEAM()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getFuncflParam was passed an atomType (%s)\n"
               "\tthat does not appear to be an EAM atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(FuncflTypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getFuncflParam could not find Funcfl\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<FuncflData> funcflData =
        std::dynamic_pointer_cast<FuncflData>(data);
    if (funcflData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getFuncflParam could not convert\n"
               "\tGenericData to FuncflData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return funcflData->getData();
  }